

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::sendError(Connection *this,ProtocolError protocolError)

{
  Promise<void> *pPVar1;
  PromiseArenaMember *pPVar2;
  Promise<void> *in_RSI;
  Promise<void> *pPVar3;
  Promise<void> promise;
  PromiseArenaMember *local_20;
  
  *(undefined1 *)((long)&in_RSI[0x2c].super_PromiseBase.node.ptr + 4) = 1;
  pPVar1 = (Promise<void> *)
           in_RSI[3].super_PromiseBase.node.ptr[5].super_PromiseArenaMember._vptr_PromiseArenaMember
  ;
  pPVar3 = in_RSI + 2;
  if (pPVar1 != (Promise<void> *)0x0) {
    pPVar3 = pPVar1;
  }
  (*(code *)(((pPVar3->super_PromiseBase).node.ptr)->super_PromiseArenaMember).
            _vptr_PromiseArenaMember)(&local_20);
  pPVar2 = local_20;
  local_20 = (PromiseArenaMember *)0x0;
  finishSendingError(this,in_RSI);
  if (pPVar2 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(pPVar2);
  }
  pPVar2 = local_20;
  if (local_20 != (PromiseArenaMember *)0x0) {
    local_20 = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose(pPVar2);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> sendError(HttpHeaders::ProtocolError protocolError) {
    closeAfterSend = true;

    // Client protocol errors always happen on request headers parsing, before we call into the
    // HttpService, meaning no response has been sent and we can provide a Response object.
    auto promise = server.settings.errorHandler.orDefault(*this).handleClientProtocolError(
        kj::mv(protocolError), *this);
    return finishSendingError(kj::mv(promise));
  }